

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O0

MatrixXd * __thiscall
CppMLNN::cross_entropy
          (MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *probs,MatrixXd *labels)

{
  double __x;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_160;
  ConstColwiseReturnType local_148;
  SumReturnType local_130;
  int local_104;
  type local_100;
  __type local_b0;
  NestedExpressionType local_a8;
  type local_a0;
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
  local_78 [56];
  undefined1 local_40 [8];
  MatrixXd log_probs;
  MatrixXd *labels_local;
  MatrixXd *probs_local;
  CppMLNN *this_local;
  
  log_probs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)labels;
  local_a8 = (NestedExpressionType)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)probs);
  local_b0 = std::pow<int,int>(10,-10);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>const>>::operator+
            (&local_a0,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>> *)&local_a8,
             &local_b0);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::log(local_78,__x);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_40,
             (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>_>
              *)local_78);
  local_104 = -1;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  cwiseProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            (&local_160,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_40,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             log_probs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::colwise(&local_148,
            (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&local_160);
  Eigen::
  VectorwiseOp<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
  ::sum(&local_130,&local_148);
  Eigen::operator*(&local_100,&local_104,(StorageBaseType *)&local_130);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::PartialReduxExpr<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::internal::member_sum<double>,0>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_100);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

MatrixXd CppMLNN::cross_entropy(const MatrixXd& probs, const MatrixXd& labels) {
	MatrixXd log_probs = (probs.array() + pow(10, -10)).log(); // plus 10^-10 to avoid log(0)
	return MatrixXd(-1 * log_probs.cwiseProduct(labels).colwise().sum());
}